

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O1

void ImGui_ImplSDL2_NewFrame(SDL_Window *window)

{
  undefined1 uVar1;
  char cVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  Uint64 UVar7;
  SDL_Window *pSVar8;
  byte *pbVar9;
  long lVar10;
  SDL_Cursor *pSVar11;
  undefined8 uVar12;
  float fVar13;
  undefined4 uVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int my;
  int mx;
  int display_h;
  int display_w;
  int h;
  int w;
  int wx;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  lVar6 = ImGui::GetIO();
  SDL_GetWindowSize(window,&local_34,&local_38);
  SDL_GL_GetDrawableSize(window,&local_3c,&local_40);
  auVar19._0_8_ = CONCAT44((float)local_38,(float)local_34);
  auVar19._8_8_ = 0;
  *(ulong *)(lVar6 + 8) = auVar19._0_8_;
  if (0 < local_38 && 0 < local_34) {
    auVar18._0_4_ = (float)local_3c;
    auVar18._4_4_ = (float)local_40;
    auVar18._8_8_ = 0;
    auVar19 = divps(auVar18,auVar19);
    *(long *)(lVar6 + 0xb8) = auVar19._0_8_;
  }
  if (ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency == '\0') {
    iVar5 = __cxa_guard_acquire(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency);
    if (iVar5 != 0) {
      ImGui_ImplSDL2_NewFrame::frequency = SDL_GetPerformanceFrequency();
      __cxa_guard_release(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency);
    }
  }
  UVar7 = SDL_GetPerformanceCounter();
  if (g_Time == 0) {
    fVar13 = 0.016666668;
  }
  else {
    lVar10 = UVar7 - g_Time;
    auVar16._8_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar16._0_8_ = lVar10;
    auVar16._12_4_ = 0x45300000;
    auVar17._8_4_ = (int)(ImGui_ImplSDL2_NewFrame::frequency >> 0x20);
    auVar17._0_8_ = ImGui_ImplSDL2_NewFrame::frequency;
    auVar17._12_4_ = 0x45300000;
    fVar13 = (float)(((auVar16._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                    ((auVar17._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)ImGui_ImplSDL2_NewFrame::frequency) -
                    4503599627370496.0)));
  }
  *(float *)(lVar6 + 0x10) = fVar13;
  g_Time = UVar7;
  lVar6 = ImGui::GetIO();
  if (*(char *)(lVar6 + 0x393) == '\x01') {
    SDL_WarpMouseInWindow(g_Window,(int)*(float *)(lVar6 + 0x120),(int)*(float *)(lVar6 + 0x124));
  }
  else {
    *(undefined8 *)(lVar6 + 0x120) = 0xff7fffffff7fffff;
  }
  uVar4 = SDL_GetMouseState(&local_44,&local_48);
  *(byte *)(lVar6 + 0x128) = (_ZL14g_MousePressed_0 | (byte)uVar4) & 1;
  *(byte *)(lVar6 + 0x129) = (byte)((uVar4 & 4) >> 2) | _ZL14g_MousePressed_1;
  *(byte *)(lVar6 + 0x12a) = (byte)((uVar4 & 2) >> 1) | _ZL14g_MousePressed_2;
  _ZL14g_MousePressed_2 = 0;
  _ZL14g_MousePressed_1 = 0;
  _ZL14g_MousePressed_0 = 0;
  pSVar8 = (SDL_Window *)SDL_GetKeyboardFocus();
  if (g_Window == pSVar8) {
    if (g_MouseCanUseGlobalState == true) {
      SDL_GetWindowPosition(pSVar8,&local_2c,&local_30);
      SDL_GetGlobalMouseState(&local_44,&local_48);
      local_44 = local_44 - local_2c;
      local_48 = local_48 - local_30;
    }
    *(ulong *)(lVar6 + 0x120) = CONCAT44((float)local_48,(float)local_44);
  }
  uVar1 = ImGui::IsAnyMouseDown();
  SDL_CaptureMouse(uVar1);
  pbVar9 = (byte *)ImGui::GetIO();
  if ((*pbVar9 & 0x20) == 0) {
    iVar5 = ImGui::GetMouseCursor();
    uVar12 = 0;
    if ((iVar5 != -1) && (pbVar9[0xc0] == 0)) {
      pSVar11 = g_MouseCursors[iVar5];
      if (g_MouseCursors[iVar5] == (SDL_Cursor *)0x0) {
        pSVar11 = g_MouseCursors[0];
      }
      SDL_SetCursor(pSVar11);
      uVar12 = 1;
    }
    SDL_ShowCursor(uVar12);
  }
  pbVar9 = (byte *)ImGui::GetIO();
  pbVar9[0x33c] = 0;
  pbVar9[0x33d] = 0;
  pbVar9[0x33e] = 0;
  pbVar9[0x33f] = 0;
  pbVar9[0x340] = 0;
  pbVar9[0x341] = 0;
  pbVar9[0x342] = 0;
  pbVar9[0x343] = 0;
  pbVar9[0x344] = 0;
  pbVar9[0x345] = 0;
  pbVar9[0x346] = 0;
  pbVar9[0x347] = 0;
  pbVar9[0x348] = 0;
  pbVar9[0x349] = 0;
  pbVar9[0x34a] = 0;
  pbVar9[0x34b] = 0;
  pbVar9[0x34c] = 0;
  pbVar9[0x34d] = 0;
  pbVar9[0x34e] = 0;
  pbVar9[0x34f] = 0;
  pbVar9[0x350] = 0;
  pbVar9[0x351] = 0;
  pbVar9[0x352] = 0;
  pbVar9[0x353] = 0;
  pbVar9[0x354] = 0;
  pbVar9[0x355] = 0;
  pbVar9[0x356] = 0;
  pbVar9[0x357] = 0;
  pbVar9[0x358] = 0;
  pbVar9[0x359] = 0;
  pbVar9[0x35a] = 0;
  pbVar9[0x35b] = 0;
  pbVar9[0x35c] = 0;
  pbVar9[0x35d] = 0;
  pbVar9[0x35e] = 0;
  pbVar9[0x35f] = 0;
  pbVar9[0x360] = 0;
  pbVar9[0x361] = 0;
  pbVar9[0x362] = 0;
  pbVar9[0x363] = 0;
  pbVar9[0x364] = 0;
  pbVar9[0x365] = 0;
  pbVar9[0x366] = 0;
  pbVar9[0x367] = 0;
  pbVar9[0x368] = 0;
  pbVar9[0x369] = 0;
  pbVar9[0x36a] = 0;
  pbVar9[0x36b] = 0;
  pbVar9[0x36c] = 0;
  pbVar9[0x36d] = 0;
  pbVar9[0x36e] = 0;
  pbVar9[0x36f] = 0;
  pbVar9[0x370] = 0;
  pbVar9[0x371] = 0;
  pbVar9[0x372] = 0;
  pbVar9[0x373] = 0;
  pbVar9[0x374] = 0;
  pbVar9[0x375] = 0;
  pbVar9[0x376] = 0;
  pbVar9[0x377] = 0;
  pbVar9[0x378] = 0;
  pbVar9[0x379] = 0;
  pbVar9[0x37a] = 0;
  pbVar9[0x37b] = 0;
  pbVar9[0x37c] = 0;
  pbVar9[0x37d] = 0;
  pbVar9[0x37e] = 0;
  pbVar9[0x37f] = 0;
  pbVar9[0x380] = 0;
  pbVar9[0x381] = 0;
  pbVar9[0x382] = 0;
  pbVar9[899] = 0;
  pbVar9[900] = 0;
  pbVar9[0x385] = 0;
  pbVar9[0x386] = 0;
  pbVar9[0x387] = 0;
  pbVar9[0x388] = 0;
  pbVar9[0x389] = 0;
  pbVar9[0x38a] = 0;
  pbVar9[0x38b] = 0;
  pbVar9[0x38c] = 0;
  pbVar9[0x38d] = 0;
  pbVar9[0x38e] = 0;
  pbVar9[0x38f] = 0;
  if ((*pbVar9 & 2) != 0) {
    lVar6 = SDL_GameControllerOpen(0);
    if (lVar6 == 0) {
      pbVar9[4] = pbVar9[4] & 0xfe;
    }
    else {
      cVar2 = SDL_GameControllerGetButton(lVar6,0);
      uVar14 = 0;
      if (cVar2 != '\0') {
        uVar14 = 0x3f800000;
      }
      *(undefined4 *)(pbVar9 + 0x33c) = uVar14;
      cVar2 = SDL_GameControllerGetButton(lVar6,1);
      uVar14 = 0;
      if (cVar2 != '\0') {
        uVar14 = 0x3f800000;
      }
      *(undefined4 *)(pbVar9 + 0x340) = uVar14;
      cVar2 = SDL_GameControllerGetButton(lVar6,2);
      uVar14 = 0;
      if (cVar2 != '\0') {
        uVar14 = 0x3f800000;
      }
      *(undefined4 *)(pbVar9 + 0x348) = uVar14;
      cVar2 = SDL_GameControllerGetButton(lVar6,3);
      uVar14 = 0;
      if (cVar2 != '\0') {
        uVar14 = 0x3f800000;
      }
      *(undefined4 *)(pbVar9 + 0x344) = uVar14;
      cVar2 = SDL_GameControllerGetButton(lVar6,0xd);
      uVar14 = 0;
      if (cVar2 != '\0') {
        uVar14 = 0x3f800000;
      }
      *(undefined4 *)(pbVar9 + 0x34c) = uVar14;
      cVar2 = SDL_GameControllerGetButton(lVar6,0xe);
      uVar14 = 0;
      if (cVar2 != '\0') {
        uVar14 = 0x3f800000;
      }
      *(undefined4 *)(pbVar9 + 0x350) = uVar14;
      cVar2 = SDL_GameControllerGetButton(lVar6,0xb);
      uVar14 = 0;
      if (cVar2 != '\0') {
        uVar14 = 0x3f800000;
      }
      *(undefined4 *)(pbVar9 + 0x354) = uVar14;
      cVar2 = SDL_GameControllerGetButton(lVar6,0xc);
      uVar14 = 0;
      if (cVar2 != '\0') {
        uVar14 = 0x3f800000;
      }
      *(undefined4 *)(pbVar9 + 0x358) = uVar14;
      cVar2 = SDL_GameControllerGetButton(lVar6,9);
      uVar14 = 0;
      if (cVar2 != '\0') {
        uVar14 = 0x3f800000;
      }
      *(undefined4 *)(pbVar9 + 0x36c) = uVar14;
      cVar2 = SDL_GameControllerGetButton(lVar6,10);
      uVar14 = 0;
      if (cVar2 != '\0') {
        uVar14 = 0x3f800000;
      }
      *(undefined4 *)(pbVar9 + 0x370) = uVar14;
      cVar2 = SDL_GameControllerGetButton(lVar6,9);
      uVar14 = 0;
      if (cVar2 != '\0') {
        uVar14 = 0x3f800000;
      }
      *(undefined4 *)(pbVar9 + 0x374) = uVar14;
      cVar2 = SDL_GameControllerGetButton(lVar6,10);
      uVar14 = 0;
      if (cVar2 != '\0') {
        uVar14 = 0x3f800000;
      }
      *(undefined4 *)(pbVar9 + 0x378) = uVar14;
      sVar3 = SDL_GameControllerGetAxis(lVar6,0);
      fVar15 = (float)(sVar3 + 8000) / -24768.0;
      fVar13 = 1.0;
      if (fVar15 <= 1.0) {
        fVar13 = fVar15;
      }
      if ((0.0 < fVar13) &&
         (*(float *)(pbVar9 + 0x35c) <= fVar13 && fVar13 != *(float *)(pbVar9 + 0x35c))) {
        *(float *)(pbVar9 + 0x35c) = fVar13;
      }
      sVar3 = SDL_GameControllerGetAxis(lVar6,0);
      fVar15 = (float)(sVar3 + -8000) / 24767.0;
      fVar13 = 1.0;
      if (fVar15 <= 1.0) {
        fVar13 = fVar15;
      }
      if ((0.0 < fVar13) &&
         (*(float *)(pbVar9 + 0x360) <= fVar13 && fVar13 != *(float *)(pbVar9 + 0x360))) {
        *(float *)(pbVar9 + 0x360) = fVar13;
      }
      sVar3 = SDL_GameControllerGetAxis(lVar6,1);
      fVar15 = (float)(sVar3 + 8000) / -24767.0;
      fVar13 = 1.0;
      if (fVar15 <= 1.0) {
        fVar13 = fVar15;
      }
      if ((0.0 < fVar13) &&
         (*(float *)(pbVar9 + 0x364) <= fVar13 && fVar13 != *(float *)(pbVar9 + 0x364))) {
        *(float *)(pbVar9 + 0x364) = fVar13;
      }
      sVar3 = SDL_GameControllerGetAxis(lVar6,1);
      fVar15 = (float)(sVar3 + -8000) / 24767.0;
      fVar13 = 1.0;
      if (fVar15 <= 1.0) {
        fVar13 = fVar15;
      }
      if ((0.0 < fVar13) &&
         (*(float *)(pbVar9 + 0x368) <= fVar13 && fVar13 != *(float *)(pbVar9 + 0x368))) {
        *(float *)(pbVar9 + 0x368) = fVar13;
      }
      pbVar9[4] = pbVar9[4] | 1;
    }
  }
  return;
}

Assistant:

void ImGui_ImplSDL2_NewFrame(SDL_Window* window)
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    SDL_GetWindowSize(window, &w, &h);
    SDL_GL_GetDrawableSize(window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / w, (float)display_h / h);

    // Setup time step (we don't use SDL_GetTicks() because it is using millisecond resolution)
    static Uint64 frequency = SDL_GetPerformanceFrequency();
    Uint64 current_time = SDL_GetPerformanceCounter();
    io.DeltaTime = g_Time > 0 ? (float)((double)(current_time - g_Time) / frequency) : (float)(1.0f / 60.0f);
    g_Time = current_time;

    ImGui_ImplSDL2_UpdateMousePosAndButtons();
    ImGui_ImplSDL2_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplSDL2_UpdateGamepads();
}